

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

string * __thiscall
cmGeneratorTarget::GetOutputName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config,
          ArtifactType artifact)

{
  cmLocalGenerator *lg;
  bool bVar1;
  char *pcVar2;
  reference prop;
  cmCompiledGeneratorExpression *this_00;
  ulong uVar3;
  cmake *this_01;
  string *psVar4;
  pointer ppVar5;
  __enable_if_t<is_constructible<value_type,_pair<const_pair<basic_string<char>,_ArtifactType>,_basic_string<char>_>_&>::value,_pair<iterator,_bool>_>
  _Var6;
  cmListFileBacktrace local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_2b8;
  undefined1 local_298 [24];
  auto_ptr<cmCompiledGeneratorExpression> cge;
  undefined1 local_260 [8];
  cmGeneratorExpression ge;
  char *outNameProp;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_230;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_228;
  const_iterator it;
  string outName;
  value_type local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  undefined1 local_138 [8];
  string configUpper;
  undefined1 local_110 [8];
  string type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  undefined1 local_b8 [8];
  value_type entry;
  _Self local_58;
  iterator i;
  OutputNameKey key;
  ArtifactType artifact_local;
  string *config_local;
  cmGeneratorTarget *this_local;
  
  key._36_4_ = artifact;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>
  ::pair<cmStateEnums::ArtifactType_&,_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>
              *)&i,config,(ArtifactType *)&key.field_0x24);
  local_58._M_node =
       (_Base_ptr)
       std::
       map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::find(&this->OutputNameMap,
              (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>
               *)&i);
  entry.second.field_2._8_8_ =
       std::
       map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       ::end(&this->OutputNameMap);
  bVar1 = std::operator==(&local_58,(_Self *)((long)&entry.second.field_2 + 8));
  if (bVar1) {
    std::
    pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>_&,_const_char_(&)[1],_true>
              ((pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_b8,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>
                *)&i,(char (*) [1])0xa67d2c);
    _Var6 = std::
            map<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>,std::__cxx11::string,std::less<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>>,std::allocator<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>>
            ::
            insert<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>&>
                      ((map<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>,std::__cxx11::string,std::less<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>>,std::allocator<std::pair<std::pair<std::__cxx11::string,cmStateEnums::ArtifactType>const,std::__cxx11::string>>>
                        *)&this->OutputNameMap,
                       (pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)local_b8);
    local_58._M_node = (_Base_ptr)_Var6.first._M_node;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&type.field_2 + 8));
    pcVar2 = GetOutputTargetType(this,key._36_4_);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)local_110,pcVar2,(allocator *)(configUpper.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator((allocator<char> *)(configUpper.field_2._M_local_buf + 0xf));
    cmsys::SystemTools::UpperCase((string *)local_138,config);
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) == 0) && (uVar3 = std::__cxx11::string::empty(), (uVar3 & 1) == 0)) {
      std::operator+(&local_178,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     "_OUTPUT_NAME_");
      std::operator+(&local_158,&local_178,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&type.field_2 + 8),&local_158);
      std::__cxx11::string::~string((string *)&local_158);
      std::__cxx11::string::~string((string *)&local_178);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::operator+(&local_198,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     "_OUTPUT_NAME");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&type.field_2 + 8),&local_198);
      std::__cxx11::string::~string((string *)&local_198);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      std::operator+(&local_1b8,"OUTPUT_NAME_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138)
      ;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&type.field_2 + 8),&local_1b8);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::operator+(&local_1d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_138,
                     "_OUTPUT_NAME");
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)((long)&type.field_2 + 8),&local_1d8);
      std::__cxx11::string::~string((string *)&local_1d8);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_1f8,"OUTPUT_NAME",(allocator *)(outName.field_2._M_local_buf + 0xf))
    ;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&type.field_2 + 8),&local_1f8);
    std::__cxx11::string::~string((string *)&local_1f8);
    std::allocator<char>::~allocator((allocator<char> *)(outName.field_2._M_local_buf + 0xf));
    std::__cxx11::string::string((string *)&it);
    local_230._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&type.field_2 + 8));
    __gnu_cxx::
    __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::__normal_iterator<std::__cxx11::string*>
              ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                *)&local_228,&local_230);
    while( true ) {
      outNameProp = (char *)std::
                            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   *)((long)&type.field_2 + 8));
      bVar1 = __gnu_cxx::operator!=
                        (&local_228,
                         (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&outNameProp);
      if (!bVar1) break;
      prop = __gnu_cxx::
             __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&local_228);
      ge.Backtrace.Cur = (Entry *)GetProperty(this,prop);
      if (ge.Backtrace.Cur != (Entry *)0x0) {
        std::__cxx11::string::operator=((string *)&it,(char *)ge.Backtrace.Cur);
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&local_228);
    }
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      psVar4 = GetName_abi_cxx11_(this);
      std::__cxx11::string::operator=((string *)&it,(string *)psVar4);
    }
    cmListFileBacktrace::cmListFileBacktrace((cmListFileBacktrace *)&cge);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_260,(cmListFileBacktrace *)&cge);
    cmListFileBacktrace::~cmListFileBacktrace((cmListFileBacktrace *)&cge);
    cmGeneratorExpression::Parse((cmGeneratorExpression *)local_298,(string *)local_260);
    local_298._8_8_ = ::cm::auto_ptr::operator_cast_to_auto_ptr_ref((auto_ptr *)local_298);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)(local_298 + 0x10),
               (auto_ptr_ref<cmCompiledGeneratorExpression>)local_298._8_8_);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)local_298);
    this_00 = ::cm::auto_ptr<cmCompiledGeneratorExpression>::operator->
                        ((auto_ptr<cmCompiledGeneratorExpression> *)(local_298 + 0x10));
    lg = this->LocalGenerator;
    std::__cxx11::string::string((string *)&local_2b8);
    pcVar2 = cmCompiledGeneratorExpression::Evaluate
                       (this_00,lg,config,false,(cmGeneratorTarget *)0x0,(cmGeneratorTarget *)0x0,
                        (cmGeneratorExpressionDAGChecker *)0x0,&local_2b8);
    ppVar5 = std::
             _Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator->(&local_58);
    std::__cxx11::string::operator=((string *)&ppVar5->second,pcVar2);
    std::__cxx11::string::~string((string *)&local_2b8);
    ::cm::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)(local_298 + 0x10));
    cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_260);
    std::__cxx11::string::~string((string *)&it);
    std::__cxx11::string::~string((string *)local_138);
    std::__cxx11::string::~string((string *)local_110);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&type.field_2 + 8));
    std::
    pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)local_b8);
  }
  else {
    std::
    _Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator->(&local_58);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) != 0) {
      this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
      psVar4 = GetName_abi_cxx11_(this);
      std::operator+(&local_2f8,"Target \'",psVar4);
      std::operator+(&local_2d8,&local_2f8,"\' OUTPUT_NAME depends on itself.");
      GetBacktrace(&local_318,this);
      cmake::IssueMessage(this_01,FATAL_ERROR,&local_2d8,&local_318);
      cmListFileBacktrace::~cmListFileBacktrace(&local_318);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::__cxx11::string::~string((string *)&local_2f8);
    }
  }
  ppVar5 = std::
           _Rb_tree_iterator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator->(&local_58);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&ppVar5->second);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>
  ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmStateEnums::ArtifactType>
           *)&i);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetOutputName(
  const std::string& config, cmStateEnums::ArtifactType artifact) const
{
  // Lookup/compute/cache the output name for this configuration.
  OutputNameKey key(config, artifact);
  cmGeneratorTarget::OutputNameMapType::iterator i =
    this->OutputNameMap.find(key);
  if (i == this->OutputNameMap.end()) {
    // Add empty name in map to detect potential recursion.
    OutputNameMapType::value_type entry(key, "");
    i = this->OutputNameMap.insert(entry).first;

    // Compute output name.
    std::vector<std::string> props;
    std::string type = this->GetOutputTargetType(artifact);
    std::string configUpper = cmSystemTools::UpperCase(config);
    if (!type.empty() && !configUpper.empty()) {
      // <ARCHIVE|LIBRARY|RUNTIME>_OUTPUT_NAME_<CONFIG>
      props.push_back(type + "_OUTPUT_NAME_" + configUpper);
    }
    if (!type.empty()) {
      // <ARCHIVE|LIBRARY|RUNTIME>_OUTPUT_NAME
      props.push_back(type + "_OUTPUT_NAME");
    }
    if (!configUpper.empty()) {
      // OUTPUT_NAME_<CONFIG>
      props.push_back("OUTPUT_NAME_" + configUpper);
      // <CONFIG>_OUTPUT_NAME
      props.push_back(configUpper + "_OUTPUT_NAME");
    }
    // OUTPUT_NAME
    props.push_back("OUTPUT_NAME");

    std::string outName;
    for (std::vector<std::string>::const_iterator it = props.begin();
         it != props.end(); ++it) {
      if (const char* outNameProp = this->GetProperty(*it)) {
        outName = outNameProp;
        break;
      }
    }

    if (outName.empty()) {
      outName = this->GetName();
    }

    // Now evaluate genex and update the previously-prepared map entry.
    cmGeneratorExpression ge;
    CM_AUTO_PTR<cmCompiledGeneratorExpression> cge = ge.Parse(outName);
    i->second = cge->Evaluate(this->LocalGenerator, config);
  } else if (i->second.empty()) {
    // An empty map entry indicates we have been called recursively
    // from the above block.
    this->LocalGenerator->GetCMakeInstance()->IssueMessage(
      cmake::FATAL_ERROR,
      "Target '" + this->GetName() + "' OUTPUT_NAME depends on itself.",
      this->GetBacktrace());
  }
  return i->second;
}